

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_Vec2Offset
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  DObject *this;
  DVector2 u;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00437ffc;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00437fec:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00437ffc:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e71,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = *(DObject **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_00437f44;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00437ffc;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_00437fec;
LAB_00437f44:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      if ((uint)numparam < 3) {
        pcVar3 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\x01') {
          if (numparam == 3) {
            if (defaultparam->Array[3].field_0.field_3.Type == '\0') {
LAB_00437fa5:
              AActor::Vec2Offset((AActor *)&u,param[1].field_0.f,param[2].field_0.f,SUB81(this,0));
              if (numret < 1) {
                iVar2 = 0;
              }
              else {
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != nullptr",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                ,0x1e75,
                                "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                VMReturn::SetVector2(ret,&u);
                iVar2 = 1;
              }
              return iVar2;
            }
            pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') goto LAB_00437fa5;
            pcVar3 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e74,
                        "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar3 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e73,
                    "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar3 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e72,
                "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vec2Offset)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_BOOL_DEF(absolute);
	ACTION_RETURN_VEC2(self->Vec2Offset(x, y, absolute));
}